

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O2

int __thiscall coda_url::create_absolute(coda_url *this,char *u,size_t sz,uint32_t flags)

{
  int iVar1;
  char *pcVar2;
  
  if (((u == (char *)0x0) || (sz == 0)) || (this->val_len != 0)) {
    reset(this);
    iVar1 = -1;
  }
  else {
    pcVar2 = (char *)malloc(sz * 2 + 0xb);
    this->val_str = pcVar2;
    create_scheme(this,u,sz,flags);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int coda_url::create_absolute(const char *u, size_t sz, uint32_t flags)
{
	if (!empty() || 0 == sz || NULL == u)
	{
		reset();
		return -1;
	}

	val_str = (char *) malloc(2 + 2 * sz + 9); // val + 0 + dom + 0 + "http[s]://" + "/"

	create_scheme(u, sz, flags);

	return 0;
}